

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgensubstruct.cpp
# Opt level: O2

void InitializeMatrices(TPZSubCompMesh *submesh,
                       TPZAutoPointer<TPZDohrSubstructCondense<double>_> *substruct,
                       TPZDohrAssembly<double> *dohrassembly)

{
  long row;
  long lVar1;
  mapped_type *permutescatter;
  TPZMatrix<double> *pTVar2;
  TPZMatRed<double,_TPZFMatrix<double>_> *pTVar3;
  int64_t iVar4;
  TPZMatRed<double,_TPZVerySparseMatrix<double>_> *obj;
  TPZDohrSubstructCondense<double> *pTVar5;
  double *pdVar6;
  TPZStepSolver<double> *pTVar7;
  long lVar8;
  long lVar9;
  long row_00;
  double extraout_XMM0_Qa;
  TPZAutoPointer<TPZMatrix<double>_> Stiffness;
  TPZAutoPointer<TPZMatrix<double>_> InternalStiffness;
  TPZAutoPointer<TPZMatrixSolver<double>_> local_2b0;
  TPZAutoPointer<TPZMatrixSolver<double>_> local_2a8;
  TPZAutoPointer<TPZDohrSubstructCondense<double>_> *local_2a0;
  TPZAutoPointer<TPZBaseMatrix> local_298;
  TPZAutoPointer<TPZMatrix<double>_> local_290;
  TPZAutoPointer<TPZBaseMatrix> local_288;
  TPZAutoPointer<TPZMatrix<double>_> local_280;
  TPZAutoPointer<TPZMatRed<double,_TPZVerySparseMatrix<double>_>_> matred;
  TPZAutoPointer<TPZMatrix<double>_> local_270;
  TPZVec<long> permuteconnectscatter;
  TPZVec<long> invpermuteconnectscatter;
  pairnumbering fromsub;
  TPZPairStructMatrix pairstructmatrix;
  TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZVerySparseMatrix<double>,_double,_TPZStructMatrixOR<double>_>
  redstruct;
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_> skylstr;
  
  fromsub.first = Submesh;
  fromsub.second = InternalFirst;
  permutescatter =
       std::
       map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
       ::operator[](&substruct->fRef->fPointer->fPermutationsScatter,&fromsub);
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>::TPZStructMatrix
            (&skylstr,&submesh->super_TPZCompMesh);
  TPZEquationFilter::Reset
            (&skylstr.super_TPZStructMatrixT<double>.super_TPZStructMatrix.fEquationFilter);
  pTVar2 = TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>::Create(&skylstr);
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer(&Stiffness,pTVar2);
  pTVar3 = (TPZMatRed<double,_TPZFMatrix<double>_> *)operator_new(800);
  lVar8 = ((Stiffness.fRef)->fPointer->super_TPZBaseMatrix).fRow;
  TPZMatRed<double,_TPZFMatrix<double>_>::TPZMatRed
            (pTVar3,(substruct->fRef->fPointer->fCoarseNodes).fNElements + lVar8,lVar8);
  local_270.fRef = Stiffness.fRef;
  LOCK();
  ((Stiffness.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((Stiffness.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  TPZMatRed<double,_TPZFMatrix<double>_>::SetK00(pTVar3,&local_270);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_270);
  TPZAutoPointer<TPZMatRed<double,_TPZFMatrix<double>_>_>::operator=
            (&substruct->fRef->fPointer->fMatRedComplete,pTVar3);
  permuteconnectscatter._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  permuteconnectscatter.fStore = (long *)0x0;
  permuteconnectscatter.fNElements = 0;
  permuteconnectscatter.fNAlloc = 0;
  iVar4 = TPZSubCompMesh::NumInternalEquations(submesh);
  substruct->fRef->fPointer->fNumInternalEquations = (int)iVar4;
  TPZSubCompMesh::PermuteInternalFirst(submesh,&permuteconnectscatter);
  TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZVerySparseMatrix<double>,_double,_TPZStructMatrixOR<double>_>
  ::TPZMatRedStructMatrix(&redstruct,submesh);
  pTVar2 = TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZVerySparseMatrix<double>,_double,_TPZStructMatrixOR<double>_>
           ::Create(&redstruct);
  if (pTVar2 == (TPZMatrix<double> *)0x0) {
    obj = (TPZMatRed<double,_TPZVerySparseMatrix<double>_> *)0x0;
  }
  else {
    obj = (TPZMatRed<double,_TPZVerySparseMatrix<double>_> *)
          __dynamic_cast(pTVar2,&TPZMatrix<double>::typeinfo,
                         &TPZMatRed<double,TPZVerySparseMatrix<double>>::typeinfo,0);
  }
  TPZAutoPointer<TPZMatRed<double,_TPZVerySparseMatrix<double>_>_>::TPZAutoPointer(&matred,obj);
  TPZPairStructMatrix::TPZPairStructMatrix
            (&pairstructmatrix,&submesh->super_TPZCompMesh,permutescatter);
  TPZVec<long>::TPZVec(&invpermuteconnectscatter,permuteconnectscatter.fNElements);
  for (lVar8 = 0; lVar8 < permuteconnectscatter.fNElements; lVar8 = lVar8 + 1) {
    invpermuteconnectscatter.fStore[permuteconnectscatter.fStore[lVar8]] = lVar8;
  }
  InternalStiffness.fRef = (obj->fK00).fRef;
  LOCK();
  ((InternalStiffness.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((InternalStiffness.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  TPZCompMesh::Permute(&submesh->super_TPZCompMesh,&invpermuteconnectscatter);
  TPZFMatrix<double>::Redim
            (&substruct->fRef->fPointer->fLocalLoad,
             ((Stiffness.fRef)->fPointer->super_TPZBaseMatrix).fRow,1);
  TPZPairStructMatrix::Assemble
            (&pairstructmatrix,(Stiffness.fRef)->fPointer,&obj->super_TPZMatrix<double>,
             &substruct->fRef->fPointer->fLocalLoad);
  TPZMatRed<double,_TPZFMatrix<double>_>::SimetrizeMatRed(pTVar3);
  TPZMatRed<double,_TPZVerySparseMatrix<double>_>::SimetrizeMatRed(obj);
  TPZManVector<double,_10>::Resize
            (&substruct->fRef->fPointer->fWeights,
             ((Stiffness.fRef)->fPointer->super_TPZBaseMatrix).fRow);
  pTVar5 = substruct->fRef->fPointer;
  for (lVar8 = 0; lVar8 < (pTVar5->fWeights).super_TPZVec<double>.fNElements; lVar8 = lVar8 + 1) {
    (*((Stiffness.fRef)->fPointer->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
              ((Stiffness.fRef)->fPointer,lVar8,lVar8);
    pTVar5 = substruct->fRef->fPointer;
    (pTVar5->fWeights).super_TPZVec<double>.fStore[lVar8] = extraout_XMM0_Qa;
  }
  lVar8 = (pTVar5->fCoarseNodes).fNElements;
  lVar1 = ((Stiffness.fRef)->fPointer->super_TPZBaseMatrix).fRow;
  lVar9 = 0;
  local_2a0 = substruct;
  if (lVar8 < 1) {
    lVar8 = lVar9;
  }
  for (; lVar8 != lVar9; lVar9 = lVar9 + 1) {
    row_00 = (long)(local_2a0->fRef->fPointer->fCoarseNodes).fStore[lVar9];
    pdVar6 = TPZMatrix<double>::operator()((Stiffness.fRef)->fPointer,row_00,row_00);
    *pdVar6 = *pdVar6 + 10.0;
    row = lVar1 + lVar9;
    pdVar6 = TPZMatrix<double>::operator()((TPZMatrix<double> *)pTVar3,row,row_00);
    *pdVar6 = 1.0;
    pdVar6 = TPZMatrix<double>::operator()((TPZMatrix<double> *)pTVar3,row_00,row);
    *pdVar6 = 1.0;
  }
  pTVar7 = (TPZStepSolver<double> *)operator_new(0x100);
  local_280.fRef = Stiffness.fRef;
  LOCK();
  ((Stiffness.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((Stiffness.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  TPZStepSolver<double>::TPZStepSolver(pTVar7,&local_280);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_280);
  local_288.fRef = (TPZReference *)Stiffness.fRef;
  LOCK();
  ((Stiffness.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((Stiffness.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  (*(pTVar7->super_TPZMatrixSolver<double>).super_TPZSolver.super_TPZSavable._vptr_TPZSavable[0xd])
            (pTVar7);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer(&local_288);
  TPZStepSolver<double>::SetDirect(pTVar7,ECholesky);
  TPZAutoPointer<TPZMatrixSolver<double>>::TPZAutoPointer<TPZStepSolver<double>>
            ((TPZAutoPointer<TPZMatrixSolver<double>> *)&local_2a8,pTVar7);
  TPZMatRed<double,_TPZFMatrix<double>_>::SetSolver(pTVar3,&local_2a8);
  TPZAutoPointer<TPZMatrixSolver<double>_>::~TPZAutoPointer(&local_2a8);
  pTVar7 = (TPZStepSolver<double> *)operator_new(0x100);
  local_290.fRef = InternalStiffness.fRef;
  LOCK();
  ((InternalStiffness.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((InternalStiffness.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  TPZStepSolver<double>::TPZStepSolver(pTVar7,&local_290);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_290);
  local_298.fRef = (TPZReference *)InternalStiffness.fRef;
  LOCK();
  ((InternalStiffness.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((InternalStiffness.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  (*(pTVar7->super_TPZMatrixSolver<double>).super_TPZSolver.super_TPZSavable._vptr_TPZSavable[0xd])
            (pTVar7);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer(&local_298);
  TPZStepSolver<double>::SetDirect(pTVar7,ECholesky);
  TPZAutoPointer<TPZMatrixSolver<double>>::TPZAutoPointer<TPZStepSolver<double>>
            ((TPZAutoPointer<TPZMatrixSolver<double>> *)&local_2b0,pTVar7);
  TPZMatRed<double,_TPZVerySparseMatrix<double>_>::SetSolver(obj,&local_2b0);
  TPZAutoPointer<TPZMatrixSolver<double>_>::~TPZAutoPointer(&local_2b0);
  iVar4 = obj->fDim1;
  (obj->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = iVar4;
  (obj->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol = iVar4;
  obj->fIsReduced = true;
  pTVar3 = (TPZMatRed<double,_TPZFMatrix<double>_> *)operator_new(800);
  TPZMatRed<double,TPZFMatrix<double>>::TPZMatRed<TPZVerySparseMatrix<double>>
            ((TPZMatRed<double,TPZFMatrix<double>> *)pTVar3,obj);
  TPZAutoPointer<TPZMatRed<double,_TPZFMatrix<double>_>_>::operator=
            (&local_2a0->fRef->fPointer->fMatRed,pTVar3);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&InternalStiffness);
  TPZVec<long>::~TPZVec(&invpermuteconnectscatter);
  TPZPairStructMatrix::~TPZPairStructMatrix(&pairstructmatrix);
  TPZAutoPointer<TPZMatRed<double,_TPZVerySparseMatrix<double>_>_>::~TPZAutoPointer(&matred);
  TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZVerySparseMatrix<double>,_double,_TPZStructMatrixOR<double>_>
  ::~TPZMatRedStructMatrix(&redstruct);
  TPZVec<long>::~TPZVec(&permuteconnectscatter);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&Stiffness);
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>::~TPZSkylineStructMatrix(&skylstr);
  return;
}

Assistant:

void InitializeMatrices(TPZSubCompMesh *submesh, TPZAutoPointer<TPZDohrSubstructCondense<STATE> > substruct, TPZDohrAssembly<STATE> &dohrassembly)
{
	typedef TPZDohrSubstructCondense<STATE>::ENumbering ENumbering;
	typedef std::pair<ENumbering,ENumbering> pairnumbering;
	pairnumbering fromsub(TPZDohrSubstructCondense<STATE>::Submesh,TPZDohrSubstructCondense<STATE>::InternalFirst);
	TPZVec<int> &permutescatter = substruct->fPermutationsScatter[fromsub];
	
	// create a skyline matrix based on the current numbering of the mesh
	// put the stiffness matrix in a TPZMatRed object to facilitate the computation of phi and zi
	TPZSkylineStructMatrix<STATE> skylstr(submesh);
	skylstr.EquationFilter().Reset();
	
	TPZAutoPointer<TPZMatrix<STATE> > Stiffness = skylstr.Create();
	TPZMatRed<STATE,TPZFMatrix<STATE> > *matredbig = new TPZMatRed<STATE, TPZFMatrix<STATE> >(Stiffness->Rows()+substruct->fCoarseNodes.NElements(),Stiffness->Rows());
	matredbig->SetK00(Stiffness);
	substruct->fMatRedComplete = matredbig;
	
	
	TPZVec<int64_t> permuteconnectscatter;
	
	substruct->fNumInternalEquations = submesh->NumInternalEquations();
	// change the sequencing of the connects of the mesh, putting the internal connects first
	submesh->PermuteInternalFirst(permuteconnectscatter);
	
	// create a "substructure matrix" based on the submesh using a skyline matrix structure as the internal matrix
	TPZMatRedStructMatrix<TPZSkylineStructMatrix<STATE>,TPZVerySparseMatrix<STATE> > redstruct(submesh);
	TPZMatRed<STATE,TPZVerySparseMatrix<STATE> > *matredptr = dynamic_cast<TPZMatRed<STATE,TPZVerySparseMatrix<STATE> > *>(redstruct.Create());
	TPZAutoPointer<TPZMatRed<STATE,TPZVerySparseMatrix<STATE> > > matred = matredptr;
	
	// create a structural matrix which will assemble both stiffnesses simultaneously
	TPZPairStructMatrix pairstructmatrix(submesh,permutescatter);
	
	// reorder the sequence numbering of the connects to reflect the original ordering
	TPZVec<int64_t> invpermuteconnectscatter(permuteconnectscatter.NElements());
	int64_t iel;
	for (iel=0; iel < permuteconnectscatter.NElements(); iel++) {
		invpermuteconnectscatter[permuteconnectscatter[iel]] = iel;
	}
	TPZAutoPointer<TPZMatrix<STATE> > InternalStiffness = matredptr->K00();
	
	
	submesh->Permute(invpermuteconnectscatter);
	
	// compute both stiffness matrices simultaneously
	substruct->fLocalLoad.Redim(Stiffness->Rows(),1);
	pairstructmatrix.Assemble(Stiffness.operator->(), matredptr, substruct->fLocalLoad);
	matredbig->SimetrizeMatRed();
	matredptr->SimetrizeMatRed();
	
	substruct->fWeights.Resize(Stiffness->Rows());
	int64_t i;
	for(i=0; i<substruct->fWeights.NElements(); i++)
	{
		substruct->fWeights[i] = Stiffness->GetVal(i,i);
	}
	// Desingularize the matrix without affecting the solution
	int64_t ncoarse = substruct->fCoarseNodes.NElements(), ic;
	int64_t neq = Stiffness->Rows();
	for(ic=0; ic<ncoarse; ic++)
	{
		int64_t coarse = substruct->fCoarseNodes[ic];
		Stiffness->operator()(coarse,coarse) += 10.;
		matredbig->operator()(neq+ic,coarse) = 1.;
		matredbig->operator()(coarse,neq+ic) = 1.;
	}
	//substruct->fStiffness = Stiffness;
	TPZStepSolver<STATE> *InvertedStiffness = new TPZStepSolver<STATE>(Stiffness);
    InvertedStiffness->SetMatrix(Stiffness);
    InvertedStiffness->SetDirect(ECholesky);
	matredbig->SetSolver(InvertedStiffness);
	
	
	TPZStepSolver<STATE> *InvertedInternalStiffness = new TPZStepSolver<STATE>(InternalStiffness);
    InvertedInternalStiffness->SetMatrix(InternalStiffness);
    InvertedInternalStiffness->SetDirect(ECholesky);
	matredptr->SetSolver(InvertedInternalStiffness);
	matredptr->SetReduced();
	TPZMatRed<STATE,TPZFMatrix<STATE> > *matred2 = new TPZMatRed<STATE,TPZFMatrix<STATE> > (*matredptr);
	
	substruct->fMatRed = matred2;
}